

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAllocator.h
# Opt level: O2

LeafNode<unsigned_long,_std::monostate,_11U,_false> * __thiscall
slang::PoolAllocator<char,192ul,64ul>::
emplace<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
          (PoolAllocator<char,192ul,64ul> *this)

{
  byte *__s;
  LeafNode<unsigned_long,_std::monostate,_11U,_false> *pLVar1;
  
  __s = *(byte **)(this + 8);
  if (__s == (byte *)0x0) {
    __s = BumpAllocator::allocate(*(BumpAllocator **)this,0xc0,0x40);
  }
  else {
    *(undefined8 *)(this + 8) = *(undefined8 *)__s;
  }
  pLVar1 = (LeafNode<unsigned_long,_std::monostate,_11U,_false> *)memset(__s,0,0xc0);
  return pLVar1;
}

Assistant:

TSubClass* emplace(Args&&... args) {
        static_assert(sizeof(TSubClass) <= Size);
        static_assert(alignof(TSubClass) <= Align);
        static_assert(std::is_trivially_destructible_v<TSubClass>);
        auto mem = freeList ? reinterpret_cast<TSubClass*>(pop())
                            : reinterpret_cast<TSubClass*>(alloc.allocate(Size, Align));
        return new (mem) TSubClass(std::forward<Args>(args)...);
    }